

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompiledEvalInternal
              (xmlXPathCompExprPtr comp,xmlXPathContextPtr ctxt,xmlXPathObjectPtr *resObjPtr,
              int toBool)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr *ppxVar3;
  xmlXPathObjectPtr obj;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,1,XML_ERR_FATAL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                    ,0x37f2,(char *)0x0,(char *)0x0,(char *)0x0,0,0,"NULL context pointer\n");
    return -1;
  }
  if (comp == (xmlXPathCompExprPtr)0x0) {
    return -1;
  }
  xmlInitParser();
  ctxt_00 = (xmlXPathParserContextPtr)(*xmlMalloc)(0x58);
  if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
LAB_001e6e68:
    xmlXPathErrMemory(ctxt,"creating evaluation context\n");
    ctxt_00 = (xmlXPathParserContextPtr)0x0;
  }
  else {
    *(undefined8 *)&ctxt_00->xptr = 0;
    ctxt_00->ancestor = (xmlNodePtr)0x0;
    ctxt_00->valueTab = (xmlXPathObjectPtr *)0x0;
    ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
    ctxt_00->value = (xmlXPathObjectPtr)0x0;
    ctxt_00->valueNr = 0;
    ctxt_00->valueMax = 0;
    *(undefined8 *)&ctxt_00->error = 0;
    ctxt_00->context = (xmlXPathContextPtr)0x0;
    ctxt_00->cur = (xmlChar *)0x0;
    ctxt_00->base = (xmlChar *)0x0;
    *(undefined8 *)&ctxt_00->valueFrame = 0;
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt_00->valueTab = ppxVar3;
    if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
      (*xmlFree)(ctxt_00);
      goto LAB_001e6e68;
    }
    ctxt_00->valueNr = 0;
    ctxt_00->valueMax = 10;
    ctxt_00->value = (xmlXPathObjectPtr)0x0;
    ctxt_00->valueFrame = 0;
    ctxt_00->context = ctxt;
    ctxt_00->comp = comp;
  }
  iVar2 = xmlXPathRunEval(ctxt_00,toBool);
  if (ctxt_00->error == 0) {
    obj = valuePop(ctxt_00);
    if (obj != (xmlXPathObjectPtr)0x0) {
      if (0 < ctxt_00->valueNr) {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar5,"xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                  (ulong)(uint)ctxt_00->valueNr);
      }
      goto LAB_001e6e91;
    }
    if (toBool == 0) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      obj = (xmlXPathObjectPtr)0x0;
      (*p_Var1)(*ppvVar5,"xmlXPathCompiledEval: No result on the stack.\n");
      goto LAB_001e6e91;
    }
  }
  obj = (xmlXPathObjectPtr)0x0;
LAB_001e6e91:
  if (resObjPtr == (xmlXPathObjectPtr *)0x0) {
    xmlXPathReleaseObject(ctxt,obj);
  }
  else {
    *resObjPtr = obj;
  }
  ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
  xmlXPathFreeParserContext(ctxt_00);
  return iVar2;
}

Assistant:

static int
xmlXPathCompiledEvalInternal(xmlXPathCompExprPtr comp,
			     xmlXPathContextPtr ctxt,
			     xmlXPathObjectPtr *resObjPtr,
			     int toBool)
{
    xmlXPathParserContextPtr pctxt;
    xmlXPathObjectPtr resObj;
#ifndef LIBXML_THREAD_ENABLED
    static int reentance = 0;
#endif
    int res;

    CHECK_CTXT_NEG(ctxt)

    if (comp == NULL)
	return(-1);
    xmlInitParser();

#ifndef LIBXML_THREAD_ENABLED
    reentance++;
    if (reentance > 1)
	xmlXPathDisableOptimizer = 1;
#endif

#ifdef DEBUG_EVAL_COUNTS
    comp->nb++;
    if ((comp->string != NULL) && (comp->nb > 100)) {
	fprintf(stderr, "100 x %s\n", comp->string);
	comp->nb = 0;
    }
#endif
    pctxt = xmlXPathCompParserContext(comp, ctxt);
    res = xmlXPathRunEval(pctxt, toBool);

    if (pctxt->error != XPATH_EXPRESSION_OK) {
        resObj = NULL;
    } else {
        resObj = valuePop(pctxt);
        if (resObj == NULL) {
            if (!toBool)
                xmlGenericError(xmlGenericErrorContext,
                    "xmlXPathCompiledEval: No result on the stack.\n");
        } else if (pctxt->valueNr > 0) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                pctxt->valueNr);
        }
    }

    if (resObjPtr)
        *resObjPtr = resObj;
    else
        xmlXPathReleaseObject(ctxt, resObj);

    pctxt->comp = NULL;
    xmlXPathFreeParserContext(pctxt);
#ifndef LIBXML_THREAD_ENABLED
    reentance--;
#endif

    return(res);
}